

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_CharCodec.cpp
# Opt level: O2

size_t __thiscall
axl::enc::CharCodec::encode_utf32
          (CharCodec *this,Array<char,_axl::sl::ArrayDetails<char>_> *buffer,StringRef_utf32 *string
          ,utf32_t replacement)

{
  C *pCVar1;
  size_t sVar2;
  C *p;
  undefined1 auVar3 [16];
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> local_158;
  char tmpBuffer [256];
  
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear(buffer);
  p = string->m_p;
  pCVar1 = p + string->m_length;
  for (; p < pCVar1; p = p + auVar3._8_8_) {
    sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::StringRefBase
              (&local_158,p,(long)pCVar1 - (long)p >> 2,false);
    auVar3 = (**(code **)(*(long *)this + 0x40))(this,tmpBuffer,0x100,&local_158,replacement);
    sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::~StringRefBase(&local_158);
    if (auVar3._8_8_ == 0) break;
    sVar2 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::append(buffer,tmpBuffer,auVar3._0_8_);
    if (sVar2 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
  }
  return (buffer->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
}

Assistant:

size_t
CharCodec::encode_utf32(
	sl::Array<char>* buffer,
	const sl::StringRef_utf32& string,
	utf32_t replacement
) {
	buffer->clear();

	const utf32_t* p = string.cp();
	const utf32_t* end = string.getEnd();
	while (p < end) {
		char tmpBuffer[256];
		ConvertLengthResult result = encode_utf32(
			tmpBuffer,
			sizeof(tmpBuffer),
			sl::StringRef_utf32(p, end - p),
			replacement
		);

		if (!result.m_srcLength)
			break;

		size_t size = buffer->append(tmpBuffer, result.m_dstLength);
		if (size == -1)
			return -1;

		p += result.m_srcLength;
	}

	return buffer->getCount();
}